

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O2

double log1p(double __x)

{
  double dVar1;
  double dVar2;
  double y;
  double z;
  
  dVar1 = __x + 1.0 + -1.0;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar2 = log(__x + 1.0);
    __x = (dVar2 * __x) / dVar1;
  }
  return __x;
}

Assistant:

double log1p(double x) {
	/*
	 * This log(1+x) algorithm is courtesy of Charles kerney and John D Cook
	 * http://www.johndcook.com/blog/2012/07/25/trick-for-computing-log1x/
	 * and 
	 * http://geographiclib.sourceforge.net/html/Math_8hpp_source.html#l00241
	 * 
	 */ 
	volatile double y,z;
	y = 1 + x;
	z = y - 1;
	return z == 0 ? x : x * log(y) / z;
}